

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

bool __thiscall HMatrix::setup_ok(HMatrix *this,int *nonbasicFlag_)

{
  uint *puVar1;
  reference pvVar2;
  long in_RSI;
  long in_RDI;
  int col_1;
  int el_1;
  int col;
  int el;
  int row;
  uint local_28;
  uint local_20;
  uint local_1c;
  
  printf("Checking row-wise matrix\n");
  local_1c = 0;
  do {
    if (*(int *)(in_RDI + 4) <= (int)local_1c) {
      return true;
    }
    puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
                                (long)(int)local_1c);
    for (local_20 = *puVar1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)(int)local_1c
                           ), (int)local_20 < *pvVar2; local_20 = local_20 + 1) {
      puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),
                                  (long)(int)local_20);
      if (*(int *)(in_RSI + (long)(int)*puVar1 * 4) == 0) {
        printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n",(ulong)*puVar1,
               (ulong)local_20,(ulong)local_1c);
        return false;
      }
    }
    puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),
                                (long)(int)local_1c);
    for (local_28 = *puVar1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),
                            (long)(int)(local_1c + 1)), (int)local_28 < *pvVar2;
        local_28 = local_28 + 1) {
      puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),
                                  (long)(int)local_28);
      if (*(int *)(in_RSI + (long)(int)*puVar1 * 4) != 0) {
        printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n",(ulong)*puVar1,
               (ulong)local_28,(ulong)local_1c);
        return false;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool HMatrix::setup_ok(const int *nonbasicFlag_) {
  printf("Checking row-wise matrix\n");
  for (int row = 0; row < numRow; row++) {
    for (int el = ARstart[row]; el < AR_Nend[row]; el++) {
      int col = ARindex[el];
      if (!nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n", col, el, row);
	return false;
      }
    }
    for (int el = AR_Nend[row]; el < ARstart[row+1]; el++) {
      int col = ARindex[el];
      if (nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n", col, el, row);
	return false;
      }
    }
  }
  return true;
}